

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O2

uint32 __thiscall Clasp::SolverParams::prepare(SolverParams *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  SolverStrategies SVar5;
  
  SVar5 = this->super_SolverStrategies;
  uVar4 = 0;
  if ((((ulong)SVar5 >> 0x33 & 1) != 0) && ((SVar5._4_4_ & 7) - 1 < 4)) {
    SVar5 = (SolverStrategies)((ulong)SVar5 & 0xfffffff8ffffffff | 0x600000000);
    this->super_SolverStrategies = SVar5;
    uVar4 = 1;
  }
  if (((ulong)SVar5 & 0x700000000) != 0x400000000) {
    if (((ulong)SVar5 & 0x700000000) == 0x500000000) {
      uVar1 = *(uint *)&this->field_0x18;
      uVar3 = uVar4 + 2;
      uVar2 = uVar1 & 0xfffc0000 | 0x10000;
      if ((uVar1 >> 0x10 & 3) - 1 < 3) {
        uVar3 = uVar4;
        uVar2 = uVar1;
      }
      uVar4 = uVar3;
      *(uint *)&this->field_0x18 = uVar2 & 0xffff0000;
    }
    if (0xffffff < *(uint *)&this->heuristic) {
      uVar4 = uVar4 | 4;
      *(uint *)&this->heuristic = *(uint *)&this->heuristic & 0xffffff;
    }
  }
  if (((ulong)SVar5 & 0x8000000000000) != 0) {
    this->super_SolverStrategies =
         (SolverStrategies)((ulong)SVar5 & 0xfffbf80700000000 | 0x60000000000);
  }
  return uVar4;
}

Assistant:

uint32 SolverParams::prepare() {
	uint32 res = 0;
	if (search == SolverStrategies::no_learning && Heuristic_t::isLookback(heuId)) {
		heuId = Heuristic_t::None;
		res  |= 1;
	}
	if (heuId == Heuristic_t::Unit) {
		if (!Lookahead::isType(lookType)) { res |= 2; lookType = Var_t::Atom; }
		lookOps = 0;
	}
	if (heuId != Heuristic_t::Domain && (heuristic.domPref || heuristic.domMod)) {
		res |= 4;
		heuristic.domPref= 0;
		heuristic.domMod = 0;
	}
	SolverStrategies::prepare();
	return res;
}